

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateBinaryOp(ExpressionTranslateContext *ctx,ExprBinaryOp *expression)

{
  int iVar1;
  TypeBase *pTVar2;
  uint uVar3;
  char *pcVar4;
  
  pTVar2 = (expression->super_ExprBase).type;
  if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
    TranslateTypeName(ctx,pTVar2);
    Print(ctx,"(");
  }
  iVar1 = *(int *)&(expression->super_ExprBase).field_0x2c;
  if (iVar1 == 5) {
    pTVar2 = expression->lhs->type;
    if ((pTVar2 != ctx->ctx->typeFloat) && (pTVar2 != ctx->ctx->typeDouble)) {
LAB_0015559c:
      Print(ctx,"(");
      Translate(ctx,expression->lhs);
      Print(ctx,")");
      pTVar2 = expression->lhs->type;
      if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
        Print(ctx,".value");
      }
      uVar3 = *(int *)&(expression->super_ExprBase).field_0x2c - 1;
      if ((0x12 < uVar3) || ((0x7ffdfU >> (uVar3 & 0x1f) & 1) == 0)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x363,"void TranslateBinaryOp(ExpressionTranslateContext &, ExprBinaryOp *)")
        ;
      }
      Print(ctx,&DAT_001f57ec + *(int *)(&DAT_001f57ec + (ulong)uVar3 * 4));
      pcVar4 = "(";
      goto LAB_0015562c;
    }
    Print(ctx,"__nullcMod((");
    Translate(ctx,expression->lhs);
    Print(ctx,"), (");
    Translate(ctx,expression->rhs);
    pcVar4 = "))";
  }
  else if (iVar1 == 0x14) {
    Print(ctx,"!!(");
    Translate(ctx,expression->lhs);
    Print(ctx,")");
    pTVar2 = expression->lhs->type;
    if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
      Print(ctx,".value");
    }
    pcVar4 = " != !!(";
LAB_0015562c:
    Print(ctx,pcVar4);
    Translate(ctx,expression->rhs);
    Print(ctx,")");
    pTVar2 = expression->rhs->type;
    if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x19)) goto LAB_001556bd;
    pcVar4 = ".value";
  }
  else {
    if (iVar1 != 6) goto LAB_0015559c;
    Print(ctx,"__nullcPow((");
    Translate(ctx,expression->lhs);
    pcVar4 = ")";
    Print(ctx,")");
    pTVar2 = expression->lhs->type;
    if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
      Print(ctx,".value");
    }
    Print(ctx,", (");
    Translate(ctx,expression->rhs);
    Print(ctx,")");
    pTVar2 = expression->rhs->type;
    if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
      Print(ctx,".value");
    }
  }
  Print(ctx,pcVar4);
LAB_001556bd:
  pTVar2 = (expression->super_ExprBase).type;
  if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
    Print(ctx,")");
    return;
  }
  return;
}

Assistant:

void TranslateBinaryOp(ExpressionTranslateContext &ctx, ExprBinaryOp *expression)
{
	if(isType<TypeEnum>(expression->type))
	{
		TranslateTypeName(ctx, expression->type);
		Print(ctx, "(");
	}

	if(expression->op == SYN_BINARY_OP_POW)
	{
		Print(ctx, "__nullcPow((");
		Translate(ctx, expression->lhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->lhs->type))
			Print(ctx, ".value");

		Print(ctx, ", (");
		Translate(ctx, expression->rhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->rhs->type))
			Print(ctx, ".value");

		Print(ctx, ")");
	}
	else if(expression->op == SYN_BINARY_OP_MOD && (expression->lhs->type == ctx.ctx.typeFloat || expression->lhs->type == ctx.ctx.typeDouble))
	{
		Print(ctx, "__nullcMod((");
		Translate(ctx, expression->lhs);
		Print(ctx, "), (");
		Translate(ctx, expression->rhs);
		Print(ctx, "))");
	}
	else if(expression->op == SYN_BINARY_OP_LOGICAL_XOR)
	{
		Print(ctx, "!!(");
		Translate(ctx, expression->lhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->lhs->type))
			Print(ctx, ".value");

		Print(ctx, " != !!(");
		Translate(ctx, expression->rhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->rhs->type))
			Print(ctx, ".value");
	}
	else
	{
		Print(ctx, "(");
		Translate(ctx, expression->lhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->lhs->type))
			Print(ctx, ".value");

		switch(expression->op)
		{
		case SYN_BINARY_OP_ADD:
			Print(ctx, " + ");
			break;
		case SYN_BINARY_OP_SUB:
			Print(ctx, " - ");
			break;
		case SYN_BINARY_OP_MUL:
			Print(ctx, " * ");
			break;
		case SYN_BINARY_OP_DIV:
			Print(ctx, " / ");
			break;
		case SYN_BINARY_OP_MOD:
			Print(ctx, " %% ");
			break;
		case SYN_BINARY_OP_SHL:
			Print(ctx, " << ");
			break;
		case SYN_BINARY_OP_SHR:
			Print(ctx, " >> ");
			break;
		case SYN_BINARY_OP_LESS:
			Print(ctx, " < ");
			break;
		case SYN_BINARY_OP_LESS_EQUAL:
			Print(ctx, " <= ");
			break;
		case SYN_BINARY_OP_GREATER:
			Print(ctx, " > ");
			break;
		case SYN_BINARY_OP_GREATER_EQUAL:
			Print(ctx, " >= ");
			break;
		case SYN_BINARY_OP_EQUAL:
			Print(ctx, " == ");
			break;
		case SYN_BINARY_OP_NOT_EQUAL:
			Print(ctx, " != ");
			break;
		case SYN_BINARY_OP_BIT_AND:
			Print(ctx, " & ");
			break;
		case SYN_BINARY_OP_BIT_OR:
			Print(ctx, " | ");
			break;
		case SYN_BINARY_OP_BIT_XOR:
			Print(ctx, " ^ ");
			break;
		case SYN_BINARY_OP_LOGICAL_AND:
			Print(ctx, " && ");
			break;
		case SYN_BINARY_OP_LOGICAL_OR:
			Print(ctx, " || ");
			break;
		default:
			assert(!"unknown type");
		}

		Print(ctx, "(");
		Translate(ctx, expression->rhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->rhs->type))
			Print(ctx, ".value");
	}

	if(isType<TypeEnum>(expression->type))
	{
		Print(ctx, ")");
	}
}